

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

ssize_t __thiscall notch::io::IDXReader::read(IDXReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  runtime_error *prVar2;
  reference input;
  reference output;
  undefined4 in_register_00000034;
  IDXReader *this_00;
  size_type local_80;
  size_t i;
  size_t nSamples;
  Dataset labels;
  undefined1 local_48 [8];
  Dataset images;
  istream *labelsIn_local;
  istream *imagesIn_local;
  IDXReader *this_local;
  LabeledDataset *dataset;
  
  this_00 = (IDXReader *)CONCAT44(in_register_00000034,__fd);
  images.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  core::LabeledDataset::LabeledDataset((LabeledDataset *)this);
  readDataset((Dataset *)local_48,this_00,(istream *)__buf,&this_00->imagesDims,this_00->imagesShape
             );
  readDataset((Dataset *)&nSamples,this_00,(istream *)__nbytes,&this_00->labelsDims,
              this_00->labelsShape);
  if (this_00->labelsDims != 1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"IDXReader: labels dataset is not 1D");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this_00->imagesShape[0] != this_00->labelsShape[0]) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"IDXReader: # of images and labels don\'t match");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = this_00->imagesShape[0];
  for (local_80 = 0; local_80 < uVar1; local_80 = local_80 + 1) {
    input = core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::
            operator[]((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
                       local_48,local_80);
    output = core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::
             operator[]((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
                        &nSamples,local_80);
    core::LabeledDataset::append((LabeledDataset *)this,input,output);
  }
  images.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&nSamples);
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)local_48);
  if ((images.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    core::LabeledDataset::~LabeledDataset((LabeledDataset *)this);
  }
  return (ssize_t)this;
}

Assistant:

LabeledDataset read(std::istream &imagesIn, std::istream &labelsIn) {
        LabeledDataset dataset;
        Dataset images = readDataset(imagesIn, &imagesDims, imagesShape);
        Dataset labels = readDataset(labelsIn, &labelsDims, labelsShape);
        if (labelsDims != 1) {
            throw std::runtime_error("IDXReader: labels dataset is not 1D");
        }
        if (imagesShape[0] != labelsShape[0]) {
            throw std::runtime_error("IDXReader: # of images and labels don't match");
        }
        size_t nSamples = imagesShape[0];
        for (size_t i = 0; i < nSamples; ++i) {
            dataset.append(images[i], labels[i]);
        }
        return dataset;
    }